

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstDumper.cc
# Opt level: O1

int __thiscall mcc::AstDumper::Visit(AstDumper *this,Typedef *typedef_stmt)

{
  element_type *peVar1;
  ostream *poVar2;
  int iVar3;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  iVar3 = this->spaces_ + 2;
  this->spaces_ = iVar3;
  poVar2 = this->out_;
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)iVar3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<typedef>\n",10);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  poVar2 = this->out_;
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)this->spaces_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<type>",6);
  poVar2 = operator<<(poVar2,&typedef_stmt->type_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</type>\n",8);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  poVar2 = this->out_;
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)this->spaces_ + '\x02');
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<name>",6);
  peVar1 = (typedef_stmt->name_).super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(peVar1->identifier_)._M_dataplus._M_p,
                      (peVar1->identifier_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</name>\n",8);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  poVar2 = this->out_;
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)this->spaces_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<typedef>\n",10);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  this->spaces_ = this->spaces_ + -2;
  return 0;
}

Assistant:

int AstDumper::Visit(Typedef& typedef_stmt) {
  spaces_ += TAB_SIZE;
  out_ << std::string(spaces_, ' ') << "<typedef>\n";
  out_ << std::string(spaces_, ' ') << "<type>"
       << typedef_stmt.type_ << "</type>\n";
  out_ << std::string(spaces_ + 2, ' ') << "<name>"
       << typedef_stmt.name_->String() << "</name>\n";
  out_ << std::string(spaces_, ' ') << "<typedef>\n";
  spaces_ -= TAB_SIZE;
  return 0;
}